

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QPodArrayOps<QAccessibleInterface*(*)(QString_const&,QObject*)>::
emplace<QAccessibleInterface*(*&)(QString_const&,QObject*)>
          (QPodArrayOps<QAccessibleInterface*(*)(QString_const&,QObject*)> *this,qsizetype i,
          _func_QAccessibleInterface_ptr_QString_ptr_QObject_ptr **args)

{
  int *piVar1;
  long lVar2;
  _func_QAccessibleInterface_ptr_QString_ptr_QObject_ptr *p_Var3;
  _func_QAccessibleInterface_ptr_QString_ptr_QObject_ptr **pp_Var4;
  GrowthPosition where;
  
  piVar1 = *(int **)this;
  if ((piVar1 == (int *)0x0) || (1 < *piVar1)) {
LAB_005912aa:
    p_Var3 = *args;
    where = (GrowthPosition)(i == 0 && *(long *)(this + 0x10) != 0);
    QArrayDataPointer<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)>::detachAndGrow
              ((QArrayDataPointer<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)> *)this,
               where,1,(_func_QAccessibleInterface_ptr_QString_ptr_QObject_ptr ***)0x0,
               (QArrayDataPointer<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)> *)0x0);
    pp_Var4 = QPodArrayOps<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)>::createHole
                        ((QPodArrayOps<QAccessibleInterface_*(*)(const_QString_&,_QObject_*)> *)this
                         ,where,i,1);
    *pp_Var4 = p_Var3;
  }
  else {
    lVar2 = *(long *)(this + 0x10);
    if ((lVar2 == i && piVar1 != (int *)0x0) &&
       (*(long *)(piVar1 + 2) !=
        ((long)(*(long *)(this + 8) - ((long)piVar1 + 0x1fU & 0xfffffffffffffff0)) >> 3) + lVar2)) {
      *(_func_QAccessibleInterface_ptr_QString_ptr_QObject_ptr **)(*(long *)(this + 8) + lVar2 * 8)
           = *args;
    }
    else {
      if (((i != 0) || (piVar1 == (int *)0x0)) ||
         (((long)piVar1 + 0x1fU & 0xfffffffffffffff0) == *(ulong *)(this + 8))) goto LAB_005912aa;
      *(_func_QAccessibleInterface_ptr_QString_ptr_QObject_ptr **)(*(long *)(this + 8) + -8) = *args
      ;
      *(long *)(this + 8) = *(long *)(this + 8) + -8;
    }
    *(long *)(this + 0x10) = lVar2 + 1;
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }